

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsIdle(uint *nextIdleTick)

{
  uint *local_18;
  uint *nextIdleTick_local;
  
  if (nextIdleTick == (uint *)0x0) {
    nextIdleTick_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_18 = nextIdleTick;
    nextIdleTick_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsIdle::__0>
                   ((anon_class_8_1_e5b2a5a2)&local_18,false,false);
  }
  return nextIdleTick_local._4_4_;
}

Assistant:

CHAKRA_API JsIdle(_Out_opt_ unsigned int *nextIdleTick)
{
    PARAM_NOT_NULL(nextIdleTick);

    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext * scriptContext) -> JsErrorCode {

            *nextIdleTick = 0;

            if (scriptContext->GetThreadContext()->GetRecycler() && scriptContext->GetThreadContext()->GetRecycler()->IsHeapEnumInProgress())
            {
                return JsErrorHeapEnumInProgress;
            }
            else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
            {
                return JsErrorInThreadServiceCallback;
            }

            JsrtContext * context = JsrtContext::GetCurrent();
            JsrtRuntime * runtime = context->GetRuntime();

            if (!runtime->UseIdle())
            {
                return JsErrorIdleNotEnabled;
            }

            unsigned int ticks = runtime->Idle();

            *nextIdleTick = ticks;

            return JsNoError;
    });
}